

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogMessage local_90;
  string local_58;
  LogFinisher local_31;
  
  iVar2 = (*this->_vptr_MessageLite[6])();
  if ((char)iVar2 == '\0') {
    message = (MessageLite *)0x1e0;
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/message_lite.cc"
               ,0x1e0);
    pLVar3 = internal::LogMessage::operator<<(&local_90,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_58,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_58);
    internal::LogFinisher::operator=(&local_31,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if ((char)iVar2 == '\0') {
    internal::LogMessage::~LogMessage(&local_90);
  }
  bVar1 = SerializePartialToArray(this,data,size);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}